

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# detail_function.h
# Opt level: O0

type dukglue::detail::FuncInfoHolder<std::__cxx11::string_const&>::FuncRuntime::
     actually_call<std::__cxx11::string_const&>
               (duk_context *ctx,
               _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr
               *funcToCall,tuple<> *args)

{
  _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *ctx_00;
  string local_48;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_28;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *return_val;
  tuple<> *args_local;
  _func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *funcToCall_local;
  duk_context *ctx_local;
  
  return_val = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)args;
  args_local = (tuple<> *)funcToCall;
  funcToCall_local =
       (_func_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_ptr *)ctx;
  local_28 = apply_fp<std::__cxx11::string_const&>(funcToCall,args);
  ctx_00 = funcToCall_local;
  std::__cxx11::string::string((string *)&local_48,(string *)local_28);
  types::DukType<std::__cxx11::string>::push<std::__cxx11::string_const&>
            ((duk_context *)ctx_00,&local_48);
  std::__cxx11::string::~string((string *)&local_48);
  return;
}

Assistant:

static typename std::enable_if<!std::is_void<Dummy>::value>::type actually_call(duk_context* ctx, RetType(*funcToCall)(Ts...), const std::tuple<BakedTs...>& args)
				{
					// ArgStorage has some static_asserts in it that validate value types,
					// so we typedef it to force ArgStorage<RetType> to compile and run the asserts
					typedef typename dukglue::types::ArgStorage<RetType>::type ValidateReturnType;

					RetType return_val = dukglue::detail::apply_fp(funcToCall, args);

					using namespace dukglue::types;
					DukType<typename Bare<RetType>::type>::template push<RetType>(ctx, std::move(return_val));
				}